

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void Curl_updateconninfo(connectdata *conn,curl_socket_t sockfd)

{
  SessionHandle *pSVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Bool _Var7;
  int iVar8;
  uint *puVar9;
  char *pcVar10;
  uint err;
  char *fmt;
  curl_socklen_t len;
  Curl_sockaddr_storage ssloc;
  Curl_sockaddr_storage ssrem;
  socklen_t local_124;
  sockaddr local_120 [8];
  sockaddr local_a0 [8];
  
  if (conn->socktype == 2) {
    return;
  }
  if ((conn->bits).reuse == false) {
    pSVar1 = conn->data;
    local_124 = 0x80;
    iVar8 = getpeername(sockfd,local_a0,&local_124);
    if (iVar8 == 0) {
      local_124 = 0x80;
      iVar8 = getsockname(sockfd,local_120,&local_124);
      if (iVar8 == 0) {
        _Var7 = getaddressinfo((sockaddr *)local_a0,conn->primary_ip,&conn->primary_port);
        if (_Var7) {
          uVar2 = *(undefined8 *)conn->primary_ip;
          uVar3 = *(undefined8 *)(conn->primary_ip + 8);
          uVar4 = *(undefined8 *)(conn->primary_ip + 0x10);
          uVar5 = *(undefined8 *)(conn->primary_ip + 0x18);
          uVar6 = *(undefined8 *)(conn->primary_ip + 0x26);
          *(undefined8 *)(conn->ip_addr_str + 0x1e) = *(undefined8 *)(conn->primary_ip + 0x1e);
          *(undefined8 *)(conn->ip_addr_str + 0x26) = uVar6;
          *(undefined8 *)(conn->ip_addr_str + 0x10) = uVar4;
          *(undefined8 *)(conn->ip_addr_str + 0x18) = uVar5;
          *(undefined8 *)conn->ip_addr_str = uVar2;
          *(undefined8 *)(conn->ip_addr_str + 8) = uVar3;
          _Var7 = getaddressinfo((sockaddr *)local_120,conn->local_ip,&conn->local_port);
          if (_Var7) goto LAB_00108349;
          puVar9 = (uint *)__errno_location();
          err = *puVar9;
          pcVar10 = Curl_strerror(conn,err);
          fmt = "ssloc inet_ntop() failed with errno %d: %s";
        }
        else {
          puVar9 = (uint *)__errno_location();
          err = *puVar9;
          pcVar10 = Curl_strerror(conn,err);
          fmt = "ssrem inet_ntop() failed with errno %d: %s";
        }
      }
      else {
        puVar9 = (uint *)__errno_location();
        err = *puVar9;
        pcVar10 = Curl_strerror(conn,err);
        fmt = "getsockname() failed with errno %d: %s";
      }
    }
    else {
      puVar9 = (uint *)__errno_location();
      err = *puVar9;
      pcVar10 = Curl_strerror(conn,err);
      fmt = "getpeername() failed with errno %d: %s";
    }
    Curl_failf(pSVar1,fmt,(ulong)err,pcVar10);
  }
  else {
LAB_00108349:
    pSVar1 = conn->data;
    uVar2 = *(undefined8 *)(conn->primary_ip + 0x26);
    *(undefined8 *)((pSVar1->info).conn_primary_ip + 0x1e) =
         *(undefined8 *)(conn->primary_ip + 0x1e);
    *(undefined8 *)((pSVar1->info).conn_primary_ip + 0x26) = uVar2;
    uVar2 = *(undefined8 *)(conn->primary_ip + 0x18);
    *(undefined8 *)((pSVar1->info).conn_primary_ip + 0x10) =
         *(undefined8 *)(conn->primary_ip + 0x10);
    *(undefined8 *)((pSVar1->info).conn_primary_ip + 0x18) = uVar2;
    uVar2 = *(undefined8 *)(conn->primary_ip + 8);
    *(undefined8 *)(pSVar1->info).conn_primary_ip = *(undefined8 *)conn->primary_ip;
    *(undefined8 *)((pSVar1->info).conn_primary_ip + 8) = uVar2;
    pSVar1 = conn->data;
    uVar2 = *(undefined8 *)(conn->local_ip + 0x18);
    *(undefined8 *)((pSVar1->info).conn_local_ip + 0x10) = *(undefined8 *)(conn->local_ip + 0x10);
    *(undefined8 *)((pSVar1->info).conn_local_ip + 0x18) = uVar2;
    uVar2 = *(undefined8 *)(conn->local_ip + 0x26);
    *(undefined8 *)((pSVar1->info).conn_local_ip + 0x1e) = *(undefined8 *)(conn->local_ip + 0x1e);
    *(undefined8 *)((pSVar1->info).conn_local_ip + 0x26) = uVar2;
    uVar2 = *(undefined8 *)(conn->local_ip + 8);
    *(undefined8 *)(pSVar1->info).conn_local_ip = *(undefined8 *)conn->local_ip;
    *(undefined8 *)((pSVar1->info).conn_local_ip + 8) = uVar2;
    pSVar1 = conn->data;
    (pSVar1->info).conn_primary_port = conn->primary_port;
    (pSVar1->info).conn_local_port = conn->local_port;
  }
  return;
}

Assistant:

void Curl_updateconninfo(struct connectdata *conn, curl_socket_t sockfd)
{
  int error;
  curl_socklen_t len;
  struct Curl_sockaddr_storage ssrem;
  struct Curl_sockaddr_storage ssloc;
  struct SessionHandle *data = conn->data;

  if(conn->socktype == SOCK_DGRAM)
    /* there's no connection! */
    return;

  if(!conn->bits.reuse) {

    len = sizeof(struct Curl_sockaddr_storage);
    if(getpeername(sockfd, (struct sockaddr*) &ssrem, &len)) {
      error = SOCKERRNO;
      failf(data, "getpeername() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

    len = sizeof(struct Curl_sockaddr_storage);
    if(getsockname(sockfd, (struct sockaddr*) &ssloc, &len)) {
      error = SOCKERRNO;
      failf(data, "getsockname() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

    if(!getaddressinfo((struct sockaddr*)&ssrem,
                        conn->primary_ip, &conn->primary_port)) {
      error = ERRNO;
      failf(data, "ssrem inet_ntop() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }
    memcpy(conn->ip_addr_str, conn->primary_ip, MAX_IPADR_LEN);

    if(!getaddressinfo((struct sockaddr*)&ssloc,
                       conn->local_ip, &conn->local_port)) {
      error = ERRNO;
      failf(data, "ssloc inet_ntop() failed with errno %d: %s",
            error, Curl_strerror(conn, error));
      return;
    }

  }

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);
}